

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void xatlas::internal::opennl::nlJacobiPreconditionerDestroy(NLJacobiPreconditioner *M)

{
  char *in_RCX;
  int in_EDX;
  int in_R8D;
  
  Realloc(M->diag_inv,0,in_EDX,in_RCX,in_R8D);
  M->diag_inv = (double *)0x0;
  return;
}

Assistant:

static void nlJacobiPreconditionerDestroy(NLJacobiPreconditioner* M)
{
	NL_DELETE_ARRAY(M->diag_inv);
}